

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.cpp
# Opt level: O0

void __thiscall
ShadingPass::execute
          (ShadingPass *this,mat4 viewMatrix,mat4 projMatrix,float zNear,float zFar,vec3 lightDir,
          mat4 lightMatrix,Cubemap *cubemap,uint albedo_tex,uint normal_tex,uint shadow_tex,
          uint rough_met_tex,uint position_tex,uint ssao_tex,Cubemap *irradiance,uint vao)

{
  undefined8 uVar1;
  QueueItem *pQVar2;
  Cubemap *pCVar3;
  bool bVar4;
  uint uVar5;
  atomic<unsigned_long> *paVar6;
  atomic<unsigned_long> *paVar7;
  uint8_t *puVar8;
  float *pfVar9;
  col_type *v;
  GpuCtxWrapper *pGVar10;
  ExplicitProducer *pEVar11;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  tmat4x4<float,_(glm::precision)0> *m;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  allocator<char> local_9d9;
  string local_9d8;
  allocator<char> local_9b1;
  string local_9b0;
  allocator<char> local_989;
  string local_988;
  allocator<char> local_961;
  string local_960;
  allocator<char> local_939;
  string local_938;
  allocator<char> local_911;
  string local_910;
  allocator<char> local_8e9;
  string local_8e8;
  allocator<char> local_8c1;
  string local_8c0;
  allocator<char> local_899;
  string local_898;
  allocator<char> local_871;
  string local_870;
  allocator<char> local_849;
  string local_848;
  allocator<char> local_821;
  string local_820;
  allocator<char> local_7f9;
  string local_7f8;
  allocator<char> local_7d1;
  string local_7d0;
  allocator<char> local_7a9;
  string local_7a8;
  allocator<char> local_781;
  string local_780;
  tmat4x4<float,_(glm::precision)0> local_760;
  undefined1 local_720 [8];
  vec3 cameraPosition;
  allocator<char> local_6e9;
  string local_6e8;
  allocator<char> local_6c1;
  string local_6c0;
  allocator<char> local_699;
  string local_698;
  allocator<char> local_671;
  string local_670;
  tmat3x3<float,_(glm::precision)0> local_650;
  tmat4x4<float,_(glm::precision)0> local_62c;
  tmat4x4<float,_(glm::precision)0> local_5ec;
  allocator<char> local_5a9;
  string local_5a8;
  Cubemap *local_588;
  Cubemap *skyboxMap;
  byte local_56a;
  byte local_569;
  uint local_568;
  GpuCtxScope ___tracy_gpu_zone;
  uint uStack_564;
  ScopedZone ___tracy_scoped_zone;
  uint rough_met_tex_local;
  uint shadow_tex_local;
  uint normal_tex_local;
  uint albedo_tex_local;
  Cubemap *cubemap_local;
  float zFar_local;
  float zNear_local;
  ShadingPass *this_local;
  undefined4 local_52c;
  undefined4 uStack_528;
  vec3 lightDir_local;
  QueueItem *item;
  atomic<unsigned_long> *__tail;
  ExplicitProducer *__token;
  index_t __magic;
  SourceLocationData *local_4f8;
  byte *local_4f0;
  QueueItem *local_4e8;
  QueueItem *item_1;
  atomic<unsigned_long> *__tail_1;
  ExplicitProducer *__token_1;
  index_t __magic_1;
  uint queryId;
  byte *local_4b8;
  QueueItem *local_4b0;
  QueueItem *item_2;
  atomic<unsigned_long> *__tail_2;
  ExplicitProducer *__token_2;
  index_t __magic_2;
  byte *pbStack_488;
  uint queryId_1;
  QueueItem *item_4;
  atomic<unsigned_long> *__tail_4;
  ExplicitProducer *__token_4;
  index_t __magic_4;
  uint queryId_2;
  QueueItem *local_450;
  QueueItem *item_3;
  atomic<unsigned_long> *__tail_3;
  ExplicitProducer *__token_3;
  index_t __magic_3;
  QueueItem *item_5;
  atomic<unsigned_long> *__tail_5;
  ExplicitProducer *__token_5;
  index_t __magic_5;
  ExplicitProducer *local_3f8;
  ExplicitProducer *local_3e8;
  ExplicitProducer *local_3e0;
  ExplicitProducer *local_3d8;
  ExplicitProducer **local_3c0;
  ExplicitProducer *local_3b8;
  ExplicitProducer **local_3a0;
  ExplicitProducer *local_398;
  ExplicitProducer **local_390;
  ExplicitProducer *local_388;
  ExplicitProducer **local_380;
  ExplicitProducer *local_378;
  undefined1 local_359;
  QueueItem *local_358;
  undefined1 local_339;
  QueueItem *local_338;
  undefined1 local_329;
  QueueItem *local_328;
  undefined1 local_319;
  QueueItem *local_318;
  long local_300;
  anon_union_31_76_853bdc15_for_QueueItem_1 *local_2f8;
  long local_2e0;
  anon_union_31_76_853bdc15_for_QueueItem_1 *local_2d8;
  long local_2d0;
  anon_union_31_76_853bdc15_for_QueueItem_1 *local_2c8;
  long local_2c0;
  anon_union_31_76_853bdc15_for_QueueItem_1 *local_2b8;
  uint64_t rdx_5;
  uint64_t rax_5;
  uint64_t rdx_3;
  uint64_t rax_3;
  uint64_t rdx_4;
  uint64_t rax_4;
  uint64_t rdx_2;
  uint64_t rax_2;
  uint64_t rdx_1;
  uint64_t rax_1;
  uint64_t rdx;
  uint64_t rax;
  undefined8 *local_248;
  SourceLocationData *local_240;
  uint64_t *local_238;
  memory_order __b_11;
  int local_204;
  memory_order __b_7;
  QueueItem *local_1f8;
  memory_order __b_9;
  undefined1 *local_1d0;
  memory_order local_1c8;
  int local_1c4;
  memory_order __b_5;
  QueueItem *local_1b8;
  undefined1 *local_1b0;
  memory_order local_1a8;
  int local_1a4;
  memory_order __b_3;
  QueueItem *local_198;
  undefined1 *local_190;
  memory_order local_188;
  int local_184;
  memory_order __b_1;
  atomic<unsigned_long> *local_178;
  ExplicitProducer *local_170;
  memory_order local_168;
  int local_164;
  memory_order __b;
  ExplicitProducer *local_158;
  memory_order local_150;
  int local_14c;
  memory_order __b_2;
  ExplicitProducer *local_140;
  memory_order local_138;
  int local_134;
  memory_order __b_4;
  memory_order __b_8;
  ExplicitProducer *local_110;
  memory_order local_108;
  int local_104;
  memory_order __b_6;
  memory_order __b_10;
  uint id_2;
  uint local_cc;
  GpuCtx *pGStack_c8;
  uint id_1;
  uint local_bc;
  GpuCtx *pGStack_b8;
  uint id;
  uint local_9c;
  GpuCtx *local_98;
  uint local_8c;
  GpuCtx *local_88;
  uint16_t local_6a;
  uint16_t *local_68;
  uint16_t local_5a;
  uint16_t *local_58;
  uint8_t local_39;
  uint8_t *local_38;
  uint8_t local_29;
  uint8_t *local_28;
  GpuCtx *local_18;
  GpuCtx *local_10;
  
  local_4f0 = &local_569;
  local_4f8 = &execute::__tracy_source_location451;
  __magic._7_1_ = 1;
  local_569 = 1;
  local_568 = rough_met_tex;
  uStack_564 = shadow_tex;
  pEVar11 = tracy::GetToken();
  paVar6 = &(pEVar11->super_ProducerBase).tailIndex;
  local_380 = &__token;
  paVar7 = &(pEVar11->super_ProducerBase).tailIndex;
  local_164 = 0;
  local_3d8 = pEVar11;
  local_378 = pEVar11;
  ___b = paVar7;
  local_168 = std::operator&(memory_order_relaxed,__memory_order_mask);
  if (local_164 - 1U < 2) {
    local_170 = (ExplicitProducer *)(paVar7->super___atomic_base<unsigned_long>)._M_i;
  }
  else if (local_164 == 5) {
    local_170 = (ExplicitProducer *)(paVar7->super___atomic_base<unsigned_long>)._M_i;
  }
  else {
    local_170 = (ExplicitProducer *)(paVar7->super___atomic_base<unsigned_long>)._M_i;
  }
  *local_380 = local_170;
  bVar4 = tracy::moodycamel::details::cqUnlikely(((ulong)*local_380 & 0xffff) == 0);
  if (bVar4) {
    tracy::moodycamel::
    ConcurrentQueue<tracy::QueueItem,_tracy::moodycamel::ConcurrentQueueDefaultTraits>::
    ExplicitProducer::enqueue_begin_alloc(pEVar11,(index_t)*local_380);
  }
  local_318 = tracy::moodycamel::
              ConcurrentQueue<tracy::QueueItem,_tracy::moodycamel::ConcurrentQueueDefaultTraits>::
              Block::operator[]((pEVar11->super_ProducerBase).tailBlock,(index_t)*local_380);
  local_319 = 0xf;
  (local_318->hdr).field_0.type = ZoneBegin;
  local_2b8 = &local_318->field_1;
  uVar1 = rdtsc();
  rax_1 = CONCAT44(extraout_var,(int)((ulong)uVar1 >> 0x20));
  rdx = CONCAT44((int)((ulong)local_318 >> 0x20),(int)uVar1);
  local_2c0 = (rax_1 << 0x20) + rdx;
  (local_2b8->frameMark).time = local_2c0;
  local_238 = &(local_318->field_1).zoneBegin.srcloc;
  local_240 = local_4f8;
  *local_238 = (uint64_t)local_4f8;
  ___b_1 = (undefined1 *)((long)&(__token->super_ProducerBase)._vptr_ProducerBase + 1);
  local_184 = 3;
  local_178 = paVar6;
  local_188 = std::operator&(memory_order_release,__memory_order_mask);
  if (local_184 == 3) {
    (paVar6->super___atomic_base<unsigned_long>)._M_i = (__int_type)___b_1;
  }
  else if (local_184 == 5) {
    LOCK();
    (paVar6->super___atomic_base<unsigned_long>)._M_i = (__int_type)___b_1;
    UNLOCK();
  }
  else {
    (paVar6->super___atomic_base<unsigned_long>)._M_i = (__int_type)___b_1;
  }
  local_190 = ___b_1;
  local_4b8 = &local_56a;
  _queryId = &execute::__tracy_gpu_source_location452;
  __magic_1._7_1_ = 1;
  local_56a = 1;
  pGVar10 = tracy::GetGpuCtx();
  pGStack_b8 = pGVar10->ptr;
  __magic_1._0_4_ = pGStack_b8->m_head;
  pGStack_b8->m_head = pGStack_b8->m_head + 1 & 0xffff;
  uVar1 = gl3wProcs.ptr[0x1b1];
  local_bc = (uint)__magic_1;
  if (pGStack_b8->m_head == pGStack_b8->m_tail) {
    __assert_fail("m_head != m_tail",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/tracy/TracyOpenGL.hpp"
                  ,0xb4,"unsigned int tracy::GpuCtx::NextQueryId()");
  }
  pGVar10 = tracy::GetGpuCtx();
  local_88 = pGVar10->ptr;
  local_8c = (uint)__magic_1;
  (*(code *)uVar1)((ulong)local_88->m_query[(uint)__magic_1],0x8e28);
  pEVar11 = tracy::GetToken();
  item_1 = (QueueItem *)&(pEVar11->super_ProducerBase).tailIndex;
  local_390 = &__token_1;
  paVar6 = &(pEVar11->super_ProducerBase).tailIndex;
  local_14c = 0;
  __tail_1 = (atomic<unsigned_long> *)pEVar11;
  local_3e0 = pEVar11;
  local_388 = pEVar11;
  ___b_2 = paVar6;
  local_150 = std::operator&(memory_order_relaxed,__memory_order_mask);
  if (local_14c - 1U < 2) {
    local_158 = (ExplicitProducer *)(paVar6->super___atomic_base<unsigned_long>)._M_i;
  }
  else if (local_14c == 5) {
    local_158 = (ExplicitProducer *)(paVar6->super___atomic_base<unsigned_long>)._M_i;
  }
  else {
    local_158 = (ExplicitProducer *)(paVar6->super___atomic_base<unsigned_long>)._M_i;
  }
  *local_390 = local_158;
  bVar4 = tracy::moodycamel::details::cqUnlikely(((ulong)*local_390 & 0xffff) == 0);
  if (bVar4) {
    tracy::moodycamel::
    ConcurrentQueue<tracy::QueueItem,_tracy::moodycamel::ConcurrentQueueDefaultTraits>::
    ExplicitProducer::enqueue_begin_alloc(pEVar11,(index_t)*local_390);
  }
  local_4e8 = tracy::moodycamel::
              ConcurrentQueue<tracy::QueueItem,_tracy::moodycamel::ConcurrentQueueDefaultTraits>::
              Block::operator[]((pEVar11->super_ProducerBase).tailBlock,(index_t)*local_390);
  local_329 = 0x21;
  (local_4e8->hdr).field_0.type = GpuZoneBegin;
  local_2c8 = &local_4e8->field_1;
  uVar1 = rdtsc();
  rax_2 = CONCAT44(extraout_var_00,(int)((ulong)uVar1 >> 0x20));
  rdx_1 = CONCAT44((int)((ulong)local_4e8 >> 0x20),(int)uVar1);
  local_2d0 = (rax_2 << 0x20) + rdx_1;
  (local_2c8->frameMark).time = local_2d0;
  (local_4e8->field_1).zoneEndThread.thread = 0;
  local_58 = &(local_4e8->field_1).lockNameFat.size;
  local_5a = (uint16_t)__magic_1;
  *local_58 = (uint16_t)__magic_1;
  puVar8 = &(local_4e8->field_1).gpuZoneBeginLean.context;
  local_328 = local_4e8;
  pGVar10 = tracy::GetGpuCtx();
  pQVar2 = item_1;
  local_10 = pGVar10->ptr;
  local_29 = local_10->m_context;
  *puVar8 = local_29;
  local_248 = (undefined8 *)((long)&(local_4e8->field_1).zoneBegin.srcloc + 7);
  rax = (uint64_t)_queryId;
  *local_248 = _queryId;
  ___b_3 = (undefined1 *)((long)&(__token_1->super_ProducerBase)._vptr_ProducerBase + 1);
  local_198 = item_1;
  local_1a4 = 3;
  local_28 = puVar8;
  local_1a8 = std::operator&(memory_order_release,__memory_order_mask);
  if (local_1a4 == 3) {
    *(undefined1 **)pQVar2 = ___b_3;
  }
  else if (local_1a4 == 5) {
    LOCK();
    *(undefined1 **)pQVar2 = ___b_3;
    UNLOCK();
  }
  else {
    *(undefined1 **)pQVar2 = ___b_3;
  }
  local_1b0 = ___b_3;
  GLScopedDebugGroup::GLScopedDebugGroup
            ((GLScopedDebugGroup *)((long)&skyboxMap + 3),"Shading pass");
  GLScopedDebugGroup::~GLScopedDebugGroup((GLScopedDebugGroup *)((long)&skyboxMap + 3));
  (*gl3wProcs.ptr[0xf])(0x8d40);
  (*gl3wProcs.ptr[0x2e])(0x4000);
  local_588 = (Cubemap *)0x0;
  pCVar3 = cubemap;
  if (this->skybox_choice != 0) {
    if (this->skybox_choice != 1) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/src/renderer.cpp"
                    ,0x1d4,
                    "void ShadingPass::execute(glm::mat4, glm::mat4, float, float, glm::vec3, glm::mat4, Cubemap *, unsigned int, unsigned int, unsigned int, unsigned int, unsigned int, unsigned int, const Cubemap &, unsigned int)"
                   );
    }
    local_588 = irradiance;
    pCVar3 = local_588;
  }
  local_588 = pCVar3;
  if (local_588 != (Cubemap *)0x0) {
    (*gl3wProcs.ptr[0x1a])((ulong)this->cube_vao);
    uVar1 = gl3wProcs.ptr[0x22f];
    uVar5 = Shader::id(&this->skybox_program);
    (*(code *)uVar1)((ulong)uVar5);
    uVar1 = gl3wProcs.ptr[0x227];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_5a8,"viewproj",&local_5a9);
    uVar5 = Shader::getLoc(&this->skybox_program,&local_5a8);
    glm::tmat3x3<float,_(glm::precision)0>::tmat3x3
              (&local_650,(tmat4x4<float,_(glm::precision)0> *)&viewMatrix);
    glm::tmat4x4<float,_(glm::precision)0>::tmat4x4(&local_62c,&local_650);
    glm::operator*(&local_5ec,&projMatrix,&local_62c);
    pfVar9 = glm::value_ptr<float,(glm::precision)0>(&local_5ec);
    (*(code *)uVar1)((ulong)uVar5,1,0,pfVar9);
    std::__cxx11::string::~string((string *)&local_5a8);
    std::allocator<char>::~allocator(&local_5a9);
    uVar1 = gl3wProcs.ptr[0x1fb];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_670,"scale",&local_671);
    uVar5 = Shader::getLoc(&this->skybox_program,&local_670);
    (*(code *)uVar1)((zNear + zFar) * 0.5,(ulong)uVar5);
    std::__cxx11::string::~string((string *)&local_670);
    std::allocator<char>::~allocator(&local_671);
    (*gl3wProcs.ptr[1])(0x84c0);
    uVar1 = gl3wProcs.ptr[0x16];
    uVar5 = Cubemap::id(local_588);
    (*(code *)uVar1)(0x8513,(ulong)uVar5);
    uVar1 = gl3wProcs.ptr[0x1fd];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_698,"skybox",&local_699);
    uVar5 = Shader::getLoc(&this->skybox_program,&local_698);
    (*(code *)uVar1)((ulong)uVar5);
    std::__cxx11::string::~string((string *)&local_698);
    std::allocator<char>::~allocator(&local_699);
    (*gl3wProcs.ptr[0x83])(4,0,0x24);
  }
  bVar4 = ImGui::CollapsingHeader("Point light",0);
  if (bVar4) {
    ImGui::ColorEdit3("Light color",execute::lightColor,0);
    ImGui::DragFloat3("Light position",execute::lightPos,0.001,-10.0,10.0,"%.3f",1.0);
    ImGui::Separator();
  }
  uVar1 = gl3wProcs.ptr[0x22f];
  uVar5 = Shader::id(&this->shading_program);
  (*(code *)uVar1)((ulong)uVar5);
  uVar1 = gl3wProcs.ptr[0x1fd];
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6c0,"pointLightsNum",&local_6c1);
  uVar5 = Shader::getLoc(&this->shading_program,&local_6c0);
  (*(code *)uVar1)((ulong)uVar5,1);
  std::__cxx11::string::~string((string *)&local_6c0);
  std::allocator<char>::~allocator(&local_6c1);
  uVar1 = gl3wProcs.ptr[0x20c];
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6e8,"pointLights[0].position",&local_6e9);
  uVar5 = Shader::getLoc(&this->shading_program,&local_6e8);
  (*(code *)uVar1)((ulong)uVar5,1,execute::lightPos);
  std::__cxx11::string::~string((string *)&local_6e8);
  std::allocator<char>::~allocator(&local_6e9);
  uVar1 = gl3wProcs.ptr[0x20c];
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)((long)&cameraPosition.field_0 + 8),"pointLights[0].color",
             (allocator<char> *)((long)&cameraPosition.field_0 + 7));
  uVar5 = Shader::getLoc(&this->shading_program,(string *)((long)&cameraPosition.field_0 + 8));
  (*(code *)uVar1)((ulong)uVar5,1,execute::lightColor);
  std::__cxx11::string::~string((string *)((long)&cameraPosition.field_0 + 8));
  std::allocator<char>::~allocator((allocator<char> *)((long)&cameraPosition.field_0 + 7));
  glm::inverse<float,(glm::precision)0,glm::tmat4x4>(&local_760,(glm *)&viewMatrix,m);
  v = glm::tmat4x4<float,_(glm::precision)0>::operator[](&local_760,3);
  glm::tvec3<float,(glm::precision)0>::tvec3<float,(glm::precision)0>
            ((tvec3<float,(glm::precision)0> *)local_720,v);
  uVar1 = gl3wProcs.ptr[0x20c];
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_780,"camPos",&local_781);
  uVar5 = Shader::getLoc(&this->shading_program,&local_780);
  pfVar9 = glm::value_ptr<float,(glm::precision)0>((tvec3<float,_(glm::precision)0> *)local_720);
  (*(code *)uVar1)((ulong)uVar5,1,pfVar9);
  std::__cxx11::string::~string((string *)&local_780);
  std::allocator<char>::~allocator(&local_781);
  uVar1 = gl3wProcs.ptr[0x1fd];
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_7a8,"albedotex",&local_7a9);
  uVar5 = Shader::getLoc(&this->shading_program,&local_7a8);
  (*(code *)uVar1)((ulong)uVar5,0);
  std::__cxx11::string::~string((string *)&local_7a8);
  std::allocator<char>::~allocator(&local_7a9);
  uVar1 = gl3wProcs.ptr[0x1fd];
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_7d0,"normaltex",&local_7d1);
  uVar5 = Shader::getLoc(&this->shading_program,&local_7d0);
  (*(code *)uVar1)((ulong)uVar5,1);
  std::__cxx11::string::~string((string *)&local_7d0);
  std::allocator<char>::~allocator(&local_7d1);
  uVar1 = gl3wProcs.ptr[0x1fd];
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_7f8,"depthtex",&local_7f9);
  uVar5 = Shader::getLoc(&this->shading_program,&local_7f8);
  (*(code *)uVar1)((ulong)uVar5,2);
  std::__cxx11::string::~string((string *)&local_7f8);
  std::allocator<char>::~allocator(&local_7f9);
  uVar1 = gl3wProcs.ptr[0x1fd];
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_820,"roughmettex",&local_821);
  uVar5 = Shader::getLoc(&this->shading_program,&local_820);
  (*(code *)uVar1)((ulong)uVar5,3);
  std::__cxx11::string::~string((string *)&local_820);
  std::allocator<char>::~allocator(&local_821);
  uVar1 = gl3wProcs.ptr[0x1fd];
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_848,"positiontex",&local_849);
  uVar5 = Shader::getLoc(&this->shading_program,&local_848);
  (*(code *)uVar1)((ulong)uVar5,4);
  std::__cxx11::string::~string((string *)&local_848);
  std::allocator<char>::~allocator(&local_849);
  uVar1 = gl3wProcs.ptr[0x1fd];
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_870,"ssaotex",&local_871);
  uVar5 = Shader::getLoc(&this->shading_program,&local_870);
  (*(code *)uVar1)((ulong)uVar5,5);
  std::__cxx11::string::~string((string *)&local_870);
  std::allocator<char>::~allocator(&local_871);
  uVar1 = gl3wProcs.ptr[0x1fd];
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_898,"irradianceMap",&local_899);
  uVar5 = Shader::getLoc(&this->shading_program,&local_898);
  (*(code *)uVar1)((ulong)uVar5,6);
  std::__cxx11::string::~string((string *)&local_898);
  std::allocator<char>::~allocator(&local_899);
  uVar1 = gl3wProcs.ptr[0x20b];
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8c0,"sunLight.dir",&local_8c1)
  ;
  uVar5 = Shader::getLoc(&this->shading_program,&local_8c0);
  local_52c = lightDir.field_0._0_4_;
  uStack_528 = lightDir.field_0._4_4_;
  (*(code *)uVar1)(local_52c,uStack_528,(ulong)lightDir.field_0._8_4_,(ulong)uVar5);
  std::__cxx11::string::~string((string *)&local_8c0);
  std::allocator<char>::~allocator(&local_8c1);
  uVar1 = gl3wProcs.ptr[0x20b];
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8e8,"sunLight.color",&local_8e9);
  uVar5 = Shader::getLoc(&this->shading_program,&local_8e8);
  (*(code *)uVar1)(0x3f800000,0x3f800000,(ulong)uVar5);
  std::__cxx11::string::~string((string *)&local_8e8);
  std::allocator<char>::~allocator(&local_8e9);
  uVar1 = gl3wProcs.ptr[0x227];
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_910,"lightSpaceMatrix",&local_911);
  uVar5 = Shader::getLoc(&this->shading_program,&local_910);
  pfVar9 = glm::value_ptr<float,(glm::precision)0>(&lightMatrix);
  (*(code *)uVar1)((ulong)uVar5,1,0,pfVar9);
  std::__cxx11::string::~string((string *)&local_910);
  std::allocator<char>::~allocator(&local_911);
  uVar1 = gl3wProcs.ptr[0x1fb];
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_938,"ambientIntensity",&local_939);
  uVar5 = Shader::getLoc(&this->shading_program,&local_938);
  (*(code *)uVar1)(this->ambient_intensity,(ulong)uVar5);
  std::__cxx11::string::~string((string *)&local_938);
  std::allocator<char>::~allocator(&local_939);
  uVar1 = gl3wProcs.ptr[0x1fb];
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_960,"shadowBias",&local_961);
  uVar5 = Shader::getLoc(&this->shading_program,&local_960);
  (*(code *)uVar1)(this->shadow_bias,(ulong)uVar5);
  std::__cxx11::string::~string((string *)&local_960);
  std::allocator<char>::~allocator(&local_961);
  uVar1 = gl3wProcs.ptr[0x1fb];
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_988,"use_pcf",&local_989);
  uVar5 = Shader::getLoc(&this->shading_program,&local_988);
  (*(code *)uVar1)((float)(this->use_pcf & 1),(ulong)uVar5);
  std::__cxx11::string::~string((string *)&local_988);
  std::allocator<char>::~allocator(&local_989);
  uVar1 = gl3wProcs.ptr[0x1ff];
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_9b0,"frame_num",&local_9b1);
  uVar5 = Shader::getLoc(&this->shading_program,&local_9b0);
  (*(code *)uVar1)((ulong)uVar5,(ulong)this->frame_num);
  std::__cxx11::string::~string((string *)&local_9b0);
  std::allocator<char>::~allocator(&local_9b1);
  uVar1 = gl3wProcs.ptr[0x1fb];
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_9d8,"pcf_radius",&local_9d9);
  uVar5 = Shader::getLoc(&this->shading_program,&local_9d8);
  (*(code *)uVar1)(this->pcf_radius,(ulong)uVar5);
  std::__cxx11::string::~string((string *)&local_9d8);
  std::allocator<char>::~allocator(&local_9d9);
  (*gl3wProcs.ptr[1])(0x84c0);
  (*gl3wProcs.ptr[0x16])(0xde1,(ulong)albedo_tex);
  (*gl3wProcs.ptr[1])(0x84c1);
  (*gl3wProcs.ptr[0x16])(0xde1,(ulong)normal_tex);
  (*gl3wProcs.ptr[1])(0x84c2);
  (*gl3wProcs.ptr[0x16])(0xde1,(ulong)uStack_564);
  (*gl3wProcs.ptr[1])(0x84c3);
  (*gl3wProcs.ptr[0x16])(0xde1,(ulong)local_568);
  (*gl3wProcs.ptr[1])(0x84c4);
  (*gl3wProcs.ptr[0x16])(0xde1,(ulong)position_tex);
  (*gl3wProcs.ptr[1])(0x84c5);
  (*gl3wProcs.ptr[0x16])(0xde1,(ulong)ssao_tex);
  (*gl3wProcs.ptr[1])(0x84c6);
  uVar1 = gl3wProcs.ptr[0x16];
  uVar5 = Cubemap::id(irradiance);
  (*(code *)uVar1)(0x8513,(ulong)uVar5);
  (*gl3wProcs.ptr[0x1a])((ulong)vao);
  (*gl3wProcs.ptr[0x83])(4,0,3);
  (*gl3wProcs.ptr[0xf])(0x8d40,0);
  this->frame_num = this->frame_num + 1;
  pbStack_488 = &local_56a;
  if ((local_56a & 1) != 0) {
    pGVar10 = tracy::GetGpuCtx();
    pGStack_c8 = pGVar10->ptr;
    __magic_2._4_4_ = pGStack_c8->m_head;
    pGStack_c8->m_head = pGStack_c8->m_head + 1 & 0xffff;
    uVar1 = gl3wProcs.ptr[0x1b1];
    local_cc = __magic_2._4_4_;
    if (pGStack_c8->m_head == pGStack_c8->m_tail) {
      __assert_fail("m_head != m_tail",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/tracy/TracyOpenGL.hpp"
                    ,0xb4,"unsigned int tracy::GpuCtx::NextQueryId()");
    }
    pGVar10 = tracy::GetGpuCtx();
    local_98 = pGVar10->ptr;
    local_9c = __magic_2._4_4_;
    (*(code *)uVar1)((ulong)local_98->m_query[__magic_2._4_4_],0x8e28);
    pEVar11 = tracy::GetToken();
    item_2 = (QueueItem *)&(pEVar11->super_ProducerBase).tailIndex;
    local_3a0 = &__token_2;
    paVar6 = &(pEVar11->super_ProducerBase).tailIndex;
    local_134 = 0;
    __tail_2 = (atomic<unsigned_long> *)pEVar11;
    local_3e8 = pEVar11;
    local_398 = pEVar11;
    ___b_4 = paVar6;
    local_138 = std::operator&(memory_order_relaxed,__memory_order_mask);
    if (local_134 - 1U < 2) {
      local_140 = (ExplicitProducer *)(paVar6->super___atomic_base<unsigned_long>)._M_i;
    }
    else if (local_134 == 5) {
      local_140 = (ExplicitProducer *)(paVar6->super___atomic_base<unsigned_long>)._M_i;
    }
    else {
      local_140 = (ExplicitProducer *)(paVar6->super___atomic_base<unsigned_long>)._M_i;
    }
    *local_3a0 = local_140;
    bVar4 = tracy::moodycamel::details::cqUnlikely(((ulong)*local_3a0 & 0xffff) == 0);
    if (bVar4) {
      tracy::moodycamel::
      ConcurrentQueue<tracy::QueueItem,_tracy::moodycamel::ConcurrentQueueDefaultTraits>::
      ExplicitProducer::enqueue_begin_alloc(pEVar11,(index_t)*local_3a0);
    }
    local_4b0 = tracy::moodycamel::
                ConcurrentQueue<tracy::QueueItem,_tracy::moodycamel::ConcurrentQueueDefaultTraits>::
                Block::operator[]((pEVar11->super_ProducerBase).tailBlock,(index_t)*local_3a0);
    local_339 = 0x25;
    (local_4b0->hdr).field_0.type = GpuZoneEnd;
    local_2d8 = &local_4b0->field_1;
    uVar1 = rdtsc();
    rax_4 = CONCAT44(extraout_var_01,(int)((ulong)uVar1 >> 0x20));
    rdx_2 = CONCAT44((int)((ulong)local_4b0 >> 0x20),(int)uVar1);
    local_2e0 = (rax_4 << 0x20) + rdx_2;
    (local_2d8->frameMark).time = local_2e0;
    (local_4b0->field_1).zoneEndThread.thread = 0;
    local_68 = &(local_4b0->field_1).lockNameFat.size;
    local_6a = __magic_2._4_2_;
    *local_68 = __magic_2._4_2_;
    puVar8 = &(local_4b0->field_1).gpuZoneBeginLean.context;
    local_338 = local_4b0;
    pGVar10 = tracy::GetGpuCtx();
    pQVar2 = item_2;
    local_18 = pGVar10->ptr;
    local_39 = local_18->m_context;
    *puVar8 = local_39;
    ___b_5 = (undefined1 *)((long)&(__token_2->super_ProducerBase)._vptr_ProducerBase + 1);
    local_1b8 = item_2;
    local_1c4 = 3;
    local_38 = puVar8;
    local_1c8 = std::operator&(memory_order_release,__memory_order_mask);
    local_1d0 = ___b_5;
    if (local_1c4 == 3) {
      *(undefined1 **)pQVar2 = ___b_5;
    }
    else if (local_1c4 == 5) {
      LOCK();
      *(undefined1 **)pQVar2 = ___b_5;
      UNLOCK();
    }
    else {
      *(undefined1 **)pQVar2 = ___b_5;
    }
  }
  __magic_3 = (index_t)&local_569;
  if ((local_569 & 1) != 0) {
    pEVar11 = tracy::GetToken();
    item_3 = (QueueItem *)&(pEVar11->super_ProducerBase).tailIndex;
    local_3c0 = &__token_3;
    paVar6 = &(pEVar11->super_ProducerBase).tailIndex;
    local_104 = 0;
    __tail_3 = (atomic<unsigned_long> *)pEVar11;
    local_3f8 = pEVar11;
    local_3b8 = pEVar11;
    ___b_6 = paVar6;
    local_108 = std::operator&(memory_order_relaxed,__memory_order_mask);
    if (local_104 - 1U < 2) {
      local_110 = (ExplicitProducer *)(paVar6->super___atomic_base<unsigned_long>)._M_i;
    }
    else if (local_104 == 5) {
      local_110 = (ExplicitProducer *)(paVar6->super___atomic_base<unsigned_long>)._M_i;
    }
    else {
      local_110 = (ExplicitProducer *)(paVar6->super___atomic_base<unsigned_long>)._M_i;
    }
    *local_3c0 = local_110;
    bVar4 = tracy::moodycamel::details::cqUnlikely(((ulong)*local_3c0 & 0xffff) == 0);
    if (bVar4) {
      tracy::moodycamel::
      ConcurrentQueue<tracy::QueueItem,_tracy::moodycamel::ConcurrentQueueDefaultTraits>::
      ExplicitProducer::enqueue_begin_alloc(pEVar11,(index_t)*local_3c0);
    }
    local_450 = tracy::moodycamel::
                ConcurrentQueue<tracy::QueueItem,_tracy::moodycamel::ConcurrentQueueDefaultTraits>::
                Block::operator[]((pEVar11->super_ProducerBase).tailBlock,(index_t)*local_3c0);
    pQVar2 = item_3;
    local_359 = 0x11;
    (local_450->hdr).field_0.type = ZoneEnd;
    local_2f8 = &local_450->field_1;
    uVar1 = rdtsc();
    rax_5 = CONCAT44(extraout_var_02,(int)((ulong)uVar1 >> 0x20));
    rdx_3 = CONCAT44((int)((ulong)local_450 >> 0x20),(int)uVar1);
    local_300 = (rax_5 << 0x20) + rdx_3;
    (local_2f8->frameMark).time = local_300;
    ___b_7 = (undefined1 *)((long)&(__token_3->super_ProducerBase)._vptr_ProducerBase + 1);
    local_1f8 = item_3;
    local_204 = 3;
    local_358 = local_450;
    std::operator&(memory_order_release,__memory_order_mask);
    if (local_204 == 3) {
      *(undefined1 **)pQVar2 = ___b_7;
    }
    else if (local_204 == 5) {
      LOCK();
      *(undefined1 **)pQVar2 = ___b_7;
      UNLOCK();
    }
    else {
      *(undefined1 **)pQVar2 = ___b_7;
    }
  }
  return;
}

Assistant:

void ShadingPass::execute(glm::mat4 viewMatrix, glm::mat4 projMatrix, float zNear, float zFar, glm::vec3 lightDir, glm::mat4 lightMatrix, Cubemap* cubemap, unsigned int albedo_tex, unsigned int normal_tex, unsigned int shadow_tex, unsigned int rough_met_tex, unsigned int position_tex, unsigned int ssao_tex, const Cubemap& irradiance, unsigned int vao)
{
    ZoneScopedN("Shading pass");
    TracyGpuZone("Shading pass");
    GLScopedDebugGroup("Shading pass");

    glBindFramebuffer(GL_FRAMEBUFFER, fbo);
    glClear(GL_COLOR_BUFFER_BIT);

    const Cubemap* skyboxMap = nullptr;
    switch(skybox_choice) {
        case 0:
            skyboxMap = cubemap;
            break;
        case 1:
            skyboxMap = &irradiance;
            break;

        default:
            assert(false);
    }

    if (skyboxMap) {
        glBindVertexArray(cube_vao);
        glUseProgram(skybox_program.id());
        glUniformMatrix4fv(skybox_program.getLoc("viewproj"), 1, GL_FALSE, glm::value_ptr(projMatrix * glm::mat4(glm::mat3(viewMatrix))));
        glUniform1f(skybox_program.getLoc("scale"), 0.5f*(zNear+zFar));
        glActiveTexture(GL_TEXTURE0);
        glBindTexture(GL_TEXTURE_CUBE_MAP, skyboxMap->id());
        glUniform1i(skybox_program.getLoc("skybox"), 0);
        glDrawArrays(GL_TRIANGLES, 0, 36);
    }

    static float lightPos[3] = { 4.f, 1.f, 6.f };
    static float lightColor[3] = { 1.f, 1.f, 1.f };
    if (ImGui::CollapsingHeader("Point light")) {
        ImGui::ColorEdit3("Light color", lightColor);
        ImGui::DragFloat3("Light position", lightPos, 0.001f, -10.f, 10.f);
        ImGui::Separator();
    }

    glUseProgram(shading_program.id());
    glUniform1i(shading_program.getLoc("pointLightsNum"), 1);
    glUniform3fv(shading_program.getLoc("pointLights[0].position"), 1, lightPos);
    glUniform3fv(shading_program.getLoc("pointLights[0].color"), 1, lightColor);
    glm::vec3 cameraPosition = glm::vec3(glm::inverse(viewMatrix)[3]);
    glUniform3fv(shading_program.getLoc("camPos"), 1, glm::value_ptr(cameraPosition));
    glUniform1i(shading_program.getLoc("albedotex"), 0);
    glUniform1i(shading_program.getLoc("normaltex"), 1);
    glUniform1i(shading_program.getLoc("depthtex"), 2);
    glUniform1i(shading_program.getLoc("roughmettex"), 3);
    glUniform1i(shading_program.getLoc("positiontex"), 4);
    glUniform1i(shading_program.getLoc("ssaotex"), 5);
    glUniform1i(shading_program.getLoc("irradianceMap"), 6);
    glUniform3f(shading_program.getLoc("sunLight.dir"), lightDir.x, lightDir.y, lightDir.z);
    glUniform3f(shading_program.getLoc("sunLight.color"), 1.f, 1.f, 1.f);
    glUniformMatrix4fv(shading_program.getLoc("lightSpaceMatrix"), 1, GL_FALSE, glm::value_ptr(lightMatrix));
    glUniform1f(shading_program.getLoc("ambientIntensity"), ambient_intensity);
    glUniform1f(shading_program.getLoc("shadowBias"), shadow_bias);
    glUniform1f(shading_program.getLoc("use_pcf"), use_pcf);
    glUniform1ui(shading_program.getLoc("frame_num"), frame_num);
    glUniform1f(shading_program.getLoc("pcf_radius"), pcf_radius);

    glActiveTexture(GL_TEXTURE0);
    glBindTexture(GL_TEXTURE_2D, albedo_tex);
    glActiveTexture(GL_TEXTURE1);
    glBindTexture(GL_TEXTURE_2D, normal_tex);
    glActiveTexture(GL_TEXTURE2);
    glBindTexture(GL_TEXTURE_2D, shadow_tex);
    glActiveTexture(GL_TEXTURE3);
    glBindTexture(GL_TEXTURE_2D, rough_met_tex);
    glActiveTexture(GL_TEXTURE4);
    glBindTexture(GL_TEXTURE_2D, position_tex);
    glActiveTexture(GL_TEXTURE5);
    glBindTexture(GL_TEXTURE_2D, ssao_tex);
    glActiveTexture(GL_TEXTURE6);
    glBindTexture(GL_TEXTURE_CUBE_MAP, irradiance.id());
    
    glBindVertexArray(vao);
    glDrawArrays(GL_TRIANGLES, 0, 3);

    glBindFramebuffer(GL_FRAMEBUFFER, 0);

    frame_num++;
}